

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

void __thiscall Assimp::Ogre::Bone::Bone(Bone *this)

{
  this->id = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->parent = (Bone *)0x0;
  this->parentId = -1;
  (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->position).x = 0.0;
  (this->position).y = 0.0;
  (this->position).z = 0.0;
  (this->rotation).w = 1.0;
  (this->rotation).x = 0.0;
  (this->rotation).y = 0.0;
  (this->rotation).z = 0.0;
  (this->scale).x = 1.0;
  (this->scale).y = 1.0;
  *(undefined8 *)&(this->scale).z = 0x3f8000003f800000;
  (this->worldMatrix).a2 = 0.0;
  (this->worldMatrix).a3 = 0.0;
  (this->worldMatrix).a4 = 0.0;
  (this->worldMatrix).b1 = 0.0;
  (this->worldMatrix).b2 = 1.0;
  (this->worldMatrix).b3 = 0.0;
  (this->worldMatrix).b4 = 0.0;
  (this->worldMatrix).c1 = 0.0;
  (this->worldMatrix).c2 = 0.0;
  (this->worldMatrix).c3 = 1.0;
  (this->worldMatrix).c4 = 0.0;
  (this->worldMatrix).d1 = 0.0;
  (this->worldMatrix).d2 = 0.0;
  (this->worldMatrix).d3 = 0.0;
  *(undefined8 *)&(this->worldMatrix).d4 = 0x3f8000003f800000;
  (this->defaultPose).a2 = 0.0;
  (this->defaultPose).a3 = 0.0;
  (this->defaultPose).a4 = 0.0;
  (this->defaultPose).b1 = 0.0;
  (this->defaultPose).b2 = 1.0;
  (this->defaultPose).b3 = 0.0;
  (this->defaultPose).b4 = 0.0;
  (this->defaultPose).c1 = 0.0;
  (this->defaultPose).c2 = 0.0;
  (this->defaultPose).c3 = 1.0;
  (this->defaultPose).c4 = 0.0;
  (this->defaultPose).d1 = 0.0;
  (this->defaultPose).d2 = 0.0;
  (this->defaultPose).d3 = 0.0;
  (this->defaultPose).d4 = 1.0;
  return;
}

Assistant:

Bone::Bone() :
    id(0),
    parent(0),
    parentId(-1),
    scale(1.0f, 1.0f, 1.0f)
{
}